

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O2

ExecutionResult * __thiscall
cmm::CMMInterpreter::executeStatement
          (ExecutionResult *__return_storage_ptr__,CMMInterpreter *this,VariableEnv *Env,
          StatementAST *Stmt)

{
  StatementKind extraout_EAX;
  StatementKind __val;
  undefined8 extraout_RAX;
  CMMInterpreter *this_00;
  CMMInterpreter *this_01;
  undefined1 auStack_48 [32];
  string local_28;
  
  this_00 = (CMMInterpreter *)auStack_48;
  this_01 = (CMMInterpreter *)auStack_48;
  if (Stmt == (StatementAST *)0x0) {
    __return_storage_ptr__->Kind = NormalStatementResult;
    goto LAB_0010a38f;
  }
  __val = Stmt->Kind;
  switch(__val) {
  case ExprStatement:
    executeExprStatement(__return_storage_ptr__,this,Env,(ExprStatementAST *)Stmt);
    break;
  case BlockStatement:
    executeBlock(__return_storage_ptr__,this,Env,(BlockAST *)Stmt);
    break;
  case IfStatement:
    executeIfStatement(__return_storage_ptr__,this,Env,(IfStatementAST *)Stmt);
    break;
  case WhileStatement:
    executeWhileStatement(__return_storage_ptr__,this,Env,(WhileStatementAST *)Stmt);
    break;
  case ForStatement:
    executeForStatement(__return_storage_ptr__,this,Env,(ForStatementAST *)Stmt);
    break;
  case ReturnStatement:
    executeReturnStatement(__return_storage_ptr__,this,Env,(ReturnStatementAST *)Stmt);
    break;
  case ContinueStatement:
    __return_storage_ptr__->Kind = ContinueStatementResult;
    goto LAB_0010a38f;
  case BreakStatement:
    __return_storage_ptr__->Kind = BreakStatementResult;
LAB_0010a38f:
    (__return_storage_ptr__->ReturnValue).Type = VoidType;
    (__return_storage_ptr__->ReturnValue).StrVal._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->ReturnValue).StrVal.field_2;
    (__return_storage_ptr__->ReturnValue).StrVal._M_string_length = 0;
    (__return_storage_ptr__->ReturnValue).StrVal.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->ReturnValue).ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ReturnValue).ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    break;
  case DeclarationStatement:
    std::__cxx11::string::string
              ((string *)auStack_48,"single declaration should not be used by user",
               (allocator *)&local_28);
    RuntimeError(this_00,(string *)auStack_48);
    __val = extraout_EAX;
  default:
    std::__cxx11::to_string(&local_28,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_48,
                   &local_28,": unknown statement kind");
    RuntimeError(this_01,(string *)auStack_48);
    std::__cxx11::string::~string((string *)auStack_48);
    std::__cxx11::string::~string((string *)&local_28);
    _Unwind_Resume(extraout_RAX);
  case DeclarationListStatement:
    executeDeclarationList(__return_storage_ptr__,this,Env,(DeclarationListAST *)Stmt);
  }
  return __return_storage_ptr__;
}

Assistant:

CMMInterpreter::ExecutionResult
CMMInterpreter::executeStatement(VariableEnv *Env, const StatementAST *Stmt) {
  if (!Stmt)
    return ExecutionResult();

  switch (Stmt->getKind()) {
  default:
    RuntimeError(std::to_string(Stmt->getKind()) + ": unknown statement kind");
  case StatementAST::DeclarationStatement:
    RuntimeError("single declaration should not be used by user");
  case StatementAST::DeclarationListStatement:
    return executeDeclarationList(Env, Stmt->as_cptr<DeclarationListAST>());
  case StatementAST::ExprStatement:
    return executeExprStatement(Env, Stmt->as_cptr<ExprStatementAST>());
  case StatementAST::BlockStatement:
    return executeBlock(Env, Stmt->as_cptr<BlockAST>());
  case StatementAST::IfStatement:
    return executeIfStatement(Env, Stmt->as_cptr<IfStatementAST>());
  case StatementAST::ReturnStatement:
    return executeReturnStatement(Env, Stmt->as_cptr<ReturnStatementAST>());
  case StatementAST::WhileStatement:
    return executeWhileStatement(Env, Stmt->as_cptr<WhileStatementAST>());
  case StatementAST::ForStatement:
    return executeForStatement(Env, Stmt->as_cptr<ForStatementAST>());
  case StatementAST::ContinueStatement:
    return executeContinueStatement(Env, Stmt->as_cptr<ContinueStatementAST>());
  case StatementAST::BreakStatement:
    return executeBreakStatement(Env, Stmt->as_cptr<BreakStatementAST>());
  }
}